

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O2

scored_action * __thiscall
v_hashmap<unsigned_char_*,_Search::scored_action>::get
          (v_hashmap<unsigned_char_*,_Search::scored_action> *this,uchar **key,uint64_t hash)

{
  hash_elem *phVar1;
  bool bVar2;
  vw_exception *this_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  string sStack_1d8;
  stringstream __msg;
  ostream local_1a8;
  
  uVar5 = (long)(this->dat).end_array - (long)(this->dat)._begin >> 5;
  uVar4 = hash % uVar5;
  this->last_position = uVar4;
  uVar3 = uVar4;
  do {
    phVar1 = (this->dat)._begin;
    if (phVar1[uVar3].occupied != true) {
LAB_00222fa4:
      return &this->default_value;
    }
    if (phVar1[uVar3].hash == hash) {
      bVar2 = is_equivalent(this,key,&phVar1[uVar3].key);
      uVar3 = this->last_position;
      if (bVar2) {
        this = (v_hashmap<unsigned_char_*,_Search::scored_action> *)((this->dat)._begin + uVar3);
        goto LAB_00222fa4;
      }
    }
    uVar3 = uVar3 + 1;
    if (uVar5 <= uVar3) {
      uVar3 = 0;
    }
    this->last_position = uVar3;
    if (uVar3 == uVar4) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<(&local_1a8,"error: v_hashmap did not grow enough!");
      this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this_00,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/v_hashmap.h"
                 ,0xe2,&sStack_1d8);
      __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  } while( true );
}

Assistant:

V& get(const K& key, uint64_t hash)
  {
    size_t sz = base_size();
    size_t first_position = hash % sz;
    last_position = first_position;
    while (true)
    {  // if there's nothing there, obviously we don't contain it
      if (!dat[last_position].occupied)
        return default_value;

      // there's something there: maybe it's us
      if ((dat[last_position].hash == hash) && is_equivalent(key, dat[last_position].key))
        return dat[last_position].val;

      // there's something there that's NOT us -- advance pointer
      // cerr << "+";
      // num_linear_steps++;
      last_position++;
      if (last_position >= sz)
        last_position = 0;

      // check to make sure we haven't cycled around -- this is a bug!
      if (last_position == first_position)
        THROW("error: v_hashmap did not grow enough!");
    }
  }